

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * mp_random_bits_fn(size_t bits,random_read_fn_t random_read)

{
  byte *b;
  mp_int *pmVar1;
  ulong factor1;
  ptrlen bytes;
  
  factor1 = bits + 7 >> 3;
  b = (byte *)safemalloc(factor1,1,0);
  (*random_read)(b,factor1);
  if (7 < bits + 7) {
    *b = *b & ('\x02' << ((char)bits - 1U & 7)) - 1U;
  }
  bytes.len = factor1;
  bytes.ptr = b;
  pmVar1 = mp_from_bytes_int(bytes,0xffffffffffffffff,factor1 - 1);
  smemclr(b,factor1);
  safefree(b);
  return pmVar1;
}

Assistant:

mp_int *mp_random_bits_fn(size_t bits, random_read_fn_t random_read)
{
    size_t bytes = (bits + 7) / 8;
    uint8_t *randbuf = snewn(bytes, uint8_t);
    random_read(randbuf, bytes);
    if (bytes)
        randbuf[0] &= (2 << ((bits-1) & 7)) - 1;
    mp_int *toret = mp_from_bytes_be(make_ptrlen(randbuf, bytes));
    smemclr(randbuf, bytes);
    sfree(randbuf);
    return toret;
}